

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.cpp
# Opt level: O2

size_t duckdb_zstd::FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  U64 sv;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  FSE_CTable FVar10;
  size_t s_1;
  ushort uVar11;
  long lVar12;
  FSE_CTable FVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  size_t pos;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  U32 s;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  
  uVar22 = 1 << ((byte)tableLog & 0x1f);
  uVar18 = (ulong)uVar22;
  uVar15 = 1;
  if (tableLog != 0) {
    uVar15 = (ulong)(uVar22 >> 1);
  }
  uVar4 = (ulong)(maxSymbolValue + 2);
  if (wkspSize < ((1L << ((byte)tableLog & 0x3f)) + uVar4 & 0xfffffffffffffffe) * 2 + 8) {
    sVar5 = 0xffffffffffffffd4;
  }
  else {
    uVar8 = uVar22 - 1;
    iVar9 = (uVar22 >> 3) + (uVar22 >> 1) + 3;
    *(short *)ct = (short)tableLog;
    *(short *)((long)ct + 2) = (short)maxSymbolValue;
    *(undefined2 *)workSpace = 0;
    uVar7 = (ulong)(maxSymbolValue + 1);
    uVar23 = 0;
    uVar20 = uVar8;
    while (uVar24 = uVar23 + 1, uVar24 <= uVar7) {
      sVar1 = *(short *)((long)workSpace + uVar23 * 2);
      if (normalizedCounter[uVar23] == -1) {
        *(short *)((long)workSpace + uVar23 * 2 + 2) = sVar1 + 1;
        uVar16 = (ulong)uVar20;
        uVar20 = uVar20 - 1;
        *(char *)((long)workSpace + uVar16 + uVar4 * 2) = (char)uVar23;
        uVar23 = uVar24;
      }
      else {
        *(short *)((long)workSpace + uVar23 * 2 + 2) = sVar1 + normalizedCounter[uVar23];
        uVar23 = uVar24;
      }
    }
    *(short *)((long)workSpace + uVar7 * 2) = (short)uVar22 + 1;
    if (uVar20 == uVar8) {
      lVar21 = (long)workSpace + uVar18 + uVar4 * 2;
      lVar6 = 0;
      lVar17 = 0;
      for (uVar23 = 0; uVar23 != uVar7; uVar23 = uVar23 + 1) {
        sVar1 = normalizedCounter[uVar23];
        *(long *)(lVar21 + lVar17) = lVar6;
        for (lVar12 = 8; lVar12 < sVar1; lVar12 = lVar12 + 8) {
          *(long *)(lVar21 + lVar17 + lVar12) = lVar6;
        }
        lVar17 = lVar17 + sVar1;
        lVar6 = lVar6 + 0x101010101010101;
      }
      uVar20 = 0;
      for (uVar23 = 0; uVar23 < uVar18; uVar23 = uVar23 + 2) {
        uVar3 = uVar20;
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          *(undefined1 *)((long)workSpace + (ulong)(uVar3 & uVar8) + uVar4 * 2) =
               *(undefined1 *)(lVar21 + lVar6);
          uVar3 = uVar3 + iVar9;
        }
        uVar20 = uVar20 + iVar9 * 2 & uVar8;
        lVar21 = lVar21 + 2;
      }
    }
    else {
      uVar23 = 0;
      for (uVar24 = 0; uVar24 != uVar7; uVar24 = uVar24 + 1) {
        uVar11 = normalizedCounter[uVar24];
        uVar3 = 0;
        if ((short)uVar11 < 1) {
          uVar11 = 0;
        }
        for (; uVar3 != uVar11; uVar3 = uVar3 + 1) {
          *(char *)((long)workSpace + uVar23 + uVar4 * 2) = (char)uVar24;
          do {
            uVar19 = (int)uVar23 + iVar9 & uVar8;
            uVar23 = (ulong)uVar19;
          } while (uVar20 < uVar19);
        }
      }
    }
    for (uVar23 = 0; uVar18 != uVar23; uVar23 = uVar23 + 1) {
      uVar24 = (ulong)*(byte *)((long)workSpace + uVar23 + uVar4 * 2);
      uVar11 = *(ushort *)((long)workSpace + uVar24 * 2);
      *(ushort *)((long)workSpace + uVar24 * 2) = uVar11 + 1;
      *(short *)((long)ct + (ulong)uVar11 * 2 + 4) = (short)uVar22 + (short)uVar23;
    }
    FVar13 = tableLog * 0x10000 - uVar22;
    sVar5 = 0;
    iVar9 = 0;
    for (uVar18 = 0; uVar7 != uVar18; uVar18 = uVar18 + 1) {
      sVar1 = normalizedCounter[uVar18];
      if ((sVar1 == -1) || (sVar1 == 1)) {
        ct[uVar15 + uVar18 * 2 + 2] = FVar13;
        ct[uVar15 + uVar18 * 2 + 1] = iVar9 - 1;
        iVar9 = iVar9 + 1;
      }
      else if (sVar1 == 0) {
        ct[uVar15 + uVar18 * 2 + 2] = FVar13 + 0x10000;
      }
      else {
        iVar14 = (int)sVar1;
        iVar2 = 0x1f;
        if (iVar14 - 1U != 0) {
          for (; iVar14 - 1U >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        FVar10 = iVar9 - iVar14;
        iVar9 = iVar9 + iVar14;
        ct[uVar15 + uVar18 * 2 + 2] =
             (tableLog - iVar2) * 0x10000 - (iVar14 << ((byte)(tableLog - iVar2) & 0x1f));
        ct[uVar15 + uVar18 * 2 + 1] = FVar10;
      }
    }
  }
  return sVar5;
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);
    U32 const maxSV1 = maxSymbolValue+1;

    U16* cumul = (U16*)workSpace;   /* size = maxSV1 */
    FSE_FUNCTION_TYPE* const tableSymbol = (FSE_FUNCTION_TYPE*)(cumul + (maxSV1+1));  /* size = tableSize */

    U32 highThreshold = tableSize-1;

    assert(((size_t)workSpace & 1) == 0);  /* Must be 2 bytes-aligned */
    if (FSE_BUILD_CTABLE_WORKSPACE_SIZE(maxSymbolValue, tableLog) > wkspSize) return ERROR(tableLog_tooLarge);
    /* CTable header */
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * https://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     ZSTD_memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSV1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                assert(normalizedCounter[u-1] >= 0);
                cumul[u] = cumul[u-1] + (U16)normalizedCounter[u-1];
                assert(cumul[u] >= cumul[u-1]);  /* no overflow */
        }   }
        cumul[maxSV1] = (U16)(tableSize+1);
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        /* Case for no low prob count symbols. Lay down 8 bytes at a time
         * to reduce branch misses since we are operating on a small block
         */
        BYTE* const spread = tableSymbol + tableSize; /* size = tableSize + 8 (may write beyond tableSize) */
        {   U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                assert(n>=0);
                pos += (size_t)n;
            }
        }
        /* Spread symbols across the table. Lack of lowprob symbols means that
         * we don't need variable sized inner loop, so we can unroll the loop and
         * reduce branch misses.
         */
        {   size_t position = 0;
            size_t s;
            size_t const unroll = 2; /* Experimentally determined optimal unroll */
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableSymbol[uPosition] = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);   /* Must have initialized all positions */
        }
    } else {
        U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<maxSV1; symbol++) {
            int nbOccurrences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurrences=0; nbOccurrences<freq; nbOccurrences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }
        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                assert(total <= INT_MAX);
                symbolTT[s].deltaFindState = (int)(total - 1);
                total ++;
                break;
            default :
                assert(normalizedCounter[s] > 1);
                {   U32 const maxBitsOut = tableLog - ZSTD_highbit32 ((U32)normalizedCounter[s]-1);
                    U32 const minStatePlus = (U32)normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = (int)(total - (unsigned)normalizedCounter[s]);
                    total +=  (unsigned)normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
    }   }
#endif

    return 0;
}